

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsysTestsCxx.cxx
# Opt level: O2

char * lowercase(char *string)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  
  sVar2 = strlen(string);
  __dest = (char *)malloc(sVar2 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,string);
    for (pcVar3 = __dest; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
      iVar1 = tolower((int)*pcVar3);
      *pcVar3 = (char)iVar1;
    }
  }
  return __dest;
}

Assistant:

static char* lowercase(const char* string)
{
  char *new_string;
  char *p;
  size_t stringSize;

  stringSize = CM_CAST(size_t, strlen(string) + 1);
  new_string = CM_CAST(char*, malloc(sizeof(char) * stringSize));

  if (new_string == CM_NULL) { /* NOLINT */
    return CM_NULL;            /* NOLINT */
  }
  strcpy(new_string, string);  /* NOLINT */
  for (p = new_string; *p != 0; ++p) {
    *p = CM_CAST(char, tolower(*p));
  }
  return new_string;
}